

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  int *piVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  int iVar6;
  long lVar7;
  ImVec4 *pIVar8;
  ImDrawCmd *__dest;
  ImGuiContext *pIVar9;
  int iVar10;
  ImDrawCmd *pIVar11;
  int iVar12;
  void *pvVar13;
  
  pIVar9 = GImGui;
  lVar7 = (long)(this->_ClipRectStack).Size;
  pIVar8 = &GNullClipRect;
  if (lVar7 != 0) {
    pIVar8 = (this->_ClipRectStack).Data + lVar7 + -1;
  }
  fVar5 = pIVar8->x;
  uVar3 = pIVar8->y;
  uVar4 = pIVar8->z;
  lVar7 = (long)(this->_TextureIdStack).Size;
  if (lVar7 == 0) {
    pvVar13 = (void *)0x0;
  }
  else {
    pvVar13 = (this->_TextureIdStack).Data[lVar7 + -1];
  }
  if (((float)uVar4 < fVar5) || (fVar2 = pIVar8->w, fVar2 < (float)uVar3)) {
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0xa8,"void ImDrawList::AddDrawCmd()");
  }
  iVar6 = (this->CmdBuffer).Size;
  if (iVar6 != (this->CmdBuffer).Capacity) {
    __dest = (this->CmdBuffer).Data;
    goto LAB_0014c2d0;
  }
  if (iVar6 == 0) {
    iVar10 = 8;
  }
  else {
    iVar10 = iVar6 / 2 + iVar6;
  }
  iVar12 = iVar6 + 1;
  if (iVar6 + 1 < iVar10) {
    iVar12 = iVar10;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (ImDrawCmd *)(*(pIVar9->IO).MemAllocFn)((long)iVar12 * 0x30);
  pIVar11 = (this->CmdBuffer).Data;
  if (pIVar11 == (ImDrawCmd *)0x0) {
LAB_0014c2b3:
    pIVar11 = (ImDrawCmd *)0x0;
    pIVar9 = GImGui;
  }
  else {
    memcpy(__dest,pIVar11,(long)(this->CmdBuffer).Size * 0x30);
    pIVar9 = GImGui;
    pIVar11 = (this->CmdBuffer).Data;
    if (pIVar11 == (ImDrawCmd *)0x0) goto LAB_0014c2b3;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar9->IO).MemFreeFn)(pIVar11);
  (this->CmdBuffer).Data = __dest;
  (this->CmdBuffer).Capacity = iVar12;
  iVar6 = (this->CmdBuffer).Size;
LAB_0014c2d0:
  (this->CmdBuffer).Size = iVar6 + 1;
  __dest[iVar6].ElemCount = 0;
  __dest[iVar6].ClipRect.x = fVar5;
  __dest[iVar6].ClipRect.y = (float)uVar3;
  __dest[iVar6].ClipRect.z = (float)uVar4;
  __dest[iVar6].ClipRect.w = fVar2;
  __dest[iVar6].TextureId = pvVar13;
  __dest[iVar6].UserCallback = (ImDrawCallback)0x0;
  (&__dest[iVar6].UserCallback)[1] = (ImDrawCallback)0x0;
  return;
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = GetCurrentClipRect();
    draw_cmd.TextureId = GetCurrentTextureId();

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}